

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

bool google::protobuf::compiler::cpp::anon_unknown_0::EmitFieldNonDefaultCondition
               (Printer *printer,string *prefix,FieldDescriptor *field)

{
  Type TVar1;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  string local_40;
  
  if ((*(int *)(field + 0x4c) == 3) || (*(long *)(field + 0x60) != 0)) {
    if (*(long *)(field + 0x60) == 0) {
      return false;
    }
    FieldName_abi_cxx11_(&local_40,(cpp *)field,field);
    io::Printer::Print(printer,"if (has_$name$()) {\n","name",&local_40);
  }
  else {
    TVar1 = FieldDescriptor::type(field);
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) == 9) {
      FieldName_abi_cxx11_(&local_40,(cpp *)field,field_00);
      io::Printer::Print(printer,"if ($prefix$$name$().size() > 0) {\n","prefix",prefix,"name",
                         &local_40);
    }
    else {
      TVar1 = FieldDescriptor::type(field);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar1 * 4) == 10) {
        FieldName_abi_cxx11_(&local_40,(cpp *)field,field_01);
        io::Printer::Print(printer,"if ($prefix$has_$name$()) {\n","prefix",prefix,"name",&local_40)
        ;
      }
      else {
        FieldName_abi_cxx11_(&local_40,(cpp *)field,field_01);
        io::Printer::Print(printer,"if ($prefix$$name$() != 0) {\n","prefix",prefix,"name",&local_40
                          );
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  io::Printer::Indent(printer);
  return true;
}

Assistant:

bool EmitFieldNonDefaultCondition(io::Printer* printer,
                                  const string& prefix,
                                  const FieldDescriptor* field) {
  // Merge and serialize semantics: primitive fields are merged/serialized only
  // if non-zero (numeric) or non-empty (string).
  if (!field->is_repeated() && !field->containing_oneof()) {
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_STRING) {
      printer->Print(
          "if ($prefix$$name$().size() > 0) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // Message fields still have has_$name$() methods.
      printer->Print(
          "if ($prefix$has_$name$()) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    } else {
      printer->Print(
          "if ($prefix$$name$() != 0) {\n",
          "prefix", prefix,
          "name", FieldName(field));
    }
    printer->Indent();
    return true;
  } else if (field->containing_oneof()) {
    printer->Print(
        "if (has_$name$()) {\n",
        "name", FieldName(field));
    printer->Indent();
    return true;
  }
  return false;
}